

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressBlockAlpha16bitC
               (uint8 *data,uint8 *img,int width,int height,int ix,int iy,int channels)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ushort uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  char cVar10;
  uint uVar11;
  uint uVar12;
  int y;
  long lVar13;
  int iVar14;
  int iVar15;
  
  iVar4 = formatSigned;
  bVar1 = *data;
  bVar2 = data[1];
  uVar8 = bVar2 >> 1 & 0xfffffff8;
  if (bVar2 < 0x10) {
    uVar8 = 1;
  }
  iVar7 = 2;
  lVar6 = 0;
  iVar15 = 0;
  do {
    lVar13 = 0;
    do {
      uVar11 = 0;
      iVar9 = -5;
      cVar10 = '\x05';
      iVar14 = iVar15;
      do {
        iVar15 = iVar14 + 1;
        if (6 < iVar14) {
          iVar15 = 0;
        }
        uVar12 = 1 << ((byte)-(iVar14 + -7) & 0x1f) & (uint)data[iVar7];
        uVar3 = uVar12 << ((char)iVar14 + (char)iVar9 & 0x1fU);
        if (iVar9 + 7 < -(iVar14 + -7)) {
          uVar3 = uVar12 >> (cVar10 - (char)iVar14 & 0x1fU);
        }
        uVar11 = uVar11 | uVar3 & 0xff;
        iVar7 = iVar7 + (uint)(6 < iVar14);
        iVar9 = iVar9 + -1;
        cVar10 = cVar10 + '\x01';
        iVar14 = iVar15;
      } while (iVar9 != -8);
      if (iVar4 == 0) {
        uVar3 = *(uint *)((long)alphaBase[0] +
                         (ulong)(((uVar11 & 0xfffffffc) - uVar11) + 3) * 4 +
                         (ulong)((bVar2 & 0xf) << 4));
        uVar12 = -uVar3;
        if ((uVar11 & 0xfffffffc) == 4) {
          uVar12 = ~uVar3;
        }
        iVar14 = -(uVar12 * uVar8);
        if ((uVar11 & 0xfffffffc) == 4) {
          iVar14 = uVar12 * uVar8;
        }
        uVar11 = iVar14 + (uint)bVar1 * 8 + 4;
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        if (0x7fe < (int)uVar11) {
          uVar11 = 0x7ff;
        }
        uVar5 = (ushort)(uVar11 >> 6) | (ushort)(uVar11 << 5);
      }
      else {
        uVar5 = get16bits11signed((char)bVar1 + 0x80,bVar2 & 0xf,(uint)(bVar2 >> 4),uVar11);
      }
      *(ushort *)(img + ((iy + lVar13) * (long)width + ix + lVar6) * (long)channels * 2) = uVar5;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  return;
}

Assistant:

void decompressBlockAlpha16bitC(uint8* data, uint8* img, int width, int height, int ix, int iy, int channels) 
{
	int alpha = data[0];
	int table = data[1];

	if(formatSigned) 
	{
		//if we have a signed format, the base value is given as a signed byte. We convert it to (0-255) here,
		//so more code can be shared with the unsigned mode.
		alpha = *((signed char*)(&data[0]));
		alpha = alpha+128;
	}

	int bit=0;
	int byte=2;
	//extract an alpha value for each pixel.
	for(int x=0; x<4; x++) 
	{
		for(int y=0; y<4; y++) 
		{
			//Extract table index
			int index=0;
			for(int bitpos=0; bitpos<3; bitpos++) 
			{
				index|=getbit(data[byte],7-bit,2-bitpos);
				bit++;
				if(bit>7) 
				{
					bit=0;
					byte++;
				}
			}
			int windex = channels*(2*(ix+x+(iy+y)*width));
#if !PGMOUT
			if(formatSigned)
			{
				*(int16 *)&img[windex] = get16bits11signed(alpha,(table%16),(table/16),index);
			}
			else
			{
				*(uint16 *)&img[windex] = get16bits11bits(alpha,(table%16),(table/16),index);
			}
#else
			//make data compatible with the .pgm format. See the comment in compressBlockAlpha16() for details.
			uint16 uSixteen;
			if (formatSigned)
			{
				//the pgm-format only allows unsigned images,
				//so we add 2^15 to get a 16-bit value.
				uSixteen = get16bits11signed(alpha,(table%16),(table/16),index) + 256*128;
			}
			else
			{
				uSixteen = get16bits11bits(alpha,(table%16),(table/16),index);
			}
			//byte swap for pgm
			img[windex] = uSixteen/256;
			img[windex+1] = uSixteen%256;
#endif

		}
	}			
}